

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.hpp
# Opt level: O0

ICmpInst * __thiscall
LLVMBC::LLVMContext::
construct<LLVMBC::ICmpInst,LLVMBC::Instruction::Predicate&,LLVMBC::Value*&,LLVMBC::Value*&>
          (LLVMContext *this,Predicate *u,Value **u_1,Value **u_2)

{
  ICmpInst *this_00;
  ICmpInst *t;
  ICmpInst *mem;
  Value **u_local_2;
  Value **u_local_1;
  Predicate *u_local;
  LLVMContext *this_local;
  
  this_00 = (ICmpInst *)allocate(this,0x78,8);
  if (this_00 == (ICmpInst *)0x0) {
    std::terminate();
  }
  ICmpInst::ICmpInst(this_00,*u,*u_1,*u_2);
  append_typed_destructor<LLVMBC::ICmpInst>(this,this_00);
  return this_00;
}

Assistant:

T *construct(U &&... u)
	{
		T *mem = static_cast<T *>(allocate(sizeof(T), alignof(T)));
		if (!mem)
			std::terminate();
		T *t = new (mem) T(std::forward<U>(u)...);

		if (!std::is_trivially_destructible<T>::value)
			append_typed_destructor(t);
		return t;
	}